

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastToTimestampSec::Operation<duckdb::date_t,duckdb::timestamp_t>
               (date_t input,timestamp_t *result,bool strict)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,result,false);
  if (((bVar2) && (lVar1 = result->value, lVar1 != -0x7fffffffffffffff)) &&
     (lVar1 != 0x7fffffffffffffff)) {
    result->value = lVar1 / 1000000;
  }
  return bVar2;
}

Assistant:

bool TryCastToTimestampSec::Operation(date_t input, timestamp_t &result, bool strict) {
	if (!TryCast::Operation<date_t, timestamp_t>(input, result, strict)) {
		return false;
	}
	if (!Timestamp::IsFinite(result)) {
		return true;
	}
	result.value /= Interval::MICROS_PER_MSEC * Interval::MSECS_PER_SEC;
	return true;
}